

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O0

void mainSimpleSort(UInt32 *ptr,UChar *block,UInt16 *quadrant,Int32 nblock,Int32 lo,Int32 hi,Int32 d
                   ,Int32 *budget)

{
  UInt32 UVar1;
  Bool_conflict BVar2;
  int iVar3;
  int local_40;
  UInt32 v;
  Int32 hp;
  Int32 bigN;
  Int32 h;
  Int32 j;
  Int32 i;
  Int32 hi_local;
  Int32 lo_local;
  Int32 nblock_local;
  UInt16 *quadrant_local;
  UChar *block_local;
  UInt32 *ptr_local;
  
  iVar3 = (hi - lo) + 1;
  if (1 < iVar3) {
    for (local_40 = 0; incs[local_40] < iVar3; local_40 = local_40 + 1) {
    }
LAB_00d2dadb:
    local_40 = local_40 + -1;
    if (-1 < local_40) {
      iVar3 = incs[local_40];
      h = lo + iVar3;
      while (h <= hi) {
        UVar1 = ptr[h];
        bigN = h;
        do {
          BVar2 = mainGtU(ptr[bigN - iVar3] + d,UVar1 + d,block,quadrant,nblock,budget);
          if (BVar2 == '\0') break;
          ptr[bigN] = ptr[bigN - iVar3];
          bigN = bigN - iVar3;
        } while (lo + iVar3 + -1 < bigN);
        ptr[bigN] = UVar1;
        bigN = h + 1;
        if (hi < bigN) break;
        UVar1 = ptr[bigN];
        do {
          BVar2 = mainGtU(ptr[bigN - iVar3] + d,UVar1 + d,block,quadrant,nblock,budget);
          if (BVar2 == '\0') break;
          ptr[bigN] = ptr[bigN - iVar3];
          bigN = bigN - iVar3;
        } while (lo + iVar3 + -1 < bigN);
        ptr[bigN] = UVar1;
        bigN = h + 2;
        if (hi < bigN) break;
        UVar1 = ptr[bigN];
        do {
          BVar2 = mainGtU(ptr[bigN - iVar3] + d,UVar1 + d,block,quadrant,nblock,budget);
          if (BVar2 == '\0') break;
          ptr[bigN] = ptr[bigN - iVar3];
          bigN = bigN - iVar3;
        } while (lo + iVar3 + -1 < bigN);
        ptr[bigN] = UVar1;
        h = h + 3;
        if (*budget < 0) {
          return;
        }
      }
      goto LAB_00d2dadb;
    }
  }
  return;
}

Assistant:

static
void mainSimpleSort ( UInt32* ptr,
                      UChar*  block,
                      UInt16* quadrant,
                      Int32   nblock,
                      Int32   lo, 
                      Int32   hi, 
                      Int32   d,
                      Int32*  budget )
{
   Int32 i, j, h, bigN, hp;
   UInt32 v;

   bigN = hi - lo + 1;
   if (bigN < 2) return;

   hp = 0;
   while (incs[hp] < bigN) hp++;
   hp--;

   for (; hp >= 0; hp--) {
      h = incs[hp];

      i = lo + h;
      while (True) {

         /*-- copy 1 --*/
         if (i > hi) break;
         v = ptr[i];
         j = i;
         while ( mainGtU ( 
                    ptr[j-h]+d, v+d, block, quadrant, nblock, budget 
                 ) ) {
            ptr[j] = ptr[j-h];
            j = j - h;
            if (j <= (lo + h - 1)) break;
         }
         ptr[j] = v;
         i++;

         /*-- copy 2 --*/
         if (i > hi) break;
         v = ptr[i];
         j = i;
         while ( mainGtU ( 
                    ptr[j-h]+d, v+d, block, quadrant, nblock, budget 
                 ) ) {
            ptr[j] = ptr[j-h];
            j = j - h;
            if (j <= (lo + h - 1)) break;
         }
         ptr[j] = v;
         i++;

         /*-- copy 3 --*/
         if (i > hi) break;
         v = ptr[i];
         j = i;
         while ( mainGtU ( 
                    ptr[j-h]+d, v+d, block, quadrant, nblock, budget 
                 ) ) {
            ptr[j] = ptr[j-h];
            j = j - h;
            if (j <= (lo + h - 1)) break;
         }
         ptr[j] = v;
         i++;

         if (*budget < 0) return;
      }
   }
}